

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QVariantList * __thiscall QVariant::toList(QVariant *this)

{
  QVariantList *in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QList<QVariant>>(in_stack_00000028);
  return in_RDI;
}

Assistant:

QVariantList QVariant::toList() const
{
    return qvariant_cast<QVariantList>(*this);
}